

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

ssl_ticket_aead_result_t __thiscall
bssl::decrypt_ticket_with_cipher_ctx
          (bssl *this,Array<unsigned_char> *out,EVP_CIPHER_CTX *cipher_ctx,HMAC_CTX *hmac_ctx,
          Span<const_unsigned_char> ticket)

{
  HMAC_CTX *pHVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uchar *len;
  ssl_ticket_aead_result_t sVar5;
  ulong len_00;
  ulong new_size;
  uchar *puVar6;
  ulong uVar7;
  int len1;
  Array<unsigned_char> plaintext;
  int len2;
  uint8_t mac [64];
  int local_ac;
  Array<unsigned_char> local_a8;
  int local_94;
  EVP_CIPHER_CTX *local_90;
  bssl *local_88;
  HMAC_CTX *local_80;
  uchar local_78 [72];
  
  puVar6 = ticket.data_;
  local_88 = this;
  local_80 = hmac_ctx;
  uVar3 = EVP_CIPHER_CTX_iv_length((EVP_CIPHER_CTX *)out);
  uVar7 = (ulong)uVar3;
  len = (uchar *)HMAC_size((HMAC_CTX *)cipher_ctx);
  if (puVar6 < len + uVar7 + 0x11) {
    return ssl_ticket_aead_ignore_ticket;
  }
  len_00 = (long)puVar6 - (long)len;
  local_90 = (EVP_CIPHER_CTX *)out;
  if (len <= puVar6) {
    puVar6 = puVar6 + (long)local_80;
    HMAC_Update((HMAC_CTX *)cipher_ctx,(uchar *)local_80,len_00);
    HMAC_Final((HMAC_CTX *)cipher_ctx,local_78,(uint *)0x0);
    iVar4 = CRYPTO_memcmp(local_78,puVar6 + -(long)len,(size_t)len);
    pHVar1 = local_80;
    if (iVar4 != 0) {
      return ssl_ticket_aead_ignore_ticket;
    }
    new_size = len_00 - (uVar7 + 0x10);
    if (uVar7 + 0x10 <= len_00) {
      local_a8.data_ = (uchar *)0x0;
      local_a8.size_ = 0;
      sVar5 = ssl_ticket_aead_ignore_ticket;
      if (new_size < 0x7fffffff) {
        bVar2 = Array<unsigned_char>::InitUninitialized(&local_a8,new_size);
        sVar5 = ssl_ticket_aead_error;
        if (bVar2) {
          iVar4 = EVP_DecryptUpdate(local_90,local_a8.data_,&local_ac,
                                    (uchar *)((long)&(pHVar1->md_ctx).md_data + uVar7),(int)new_size
                                   );
          if ((iVar4 == 0) ||
             (iVar4 = EVP_DecryptFinal_ex(local_90,local_a8.data_ + local_ac,&local_94), iVar4 == 0)
             ) {
            ERR_clear_error();
            sVar5 = ssl_ticket_aead_ignore_ticket;
          }
          else {
            if (local_a8.size_ < (ulong)((long)local_94 + (long)local_ac)) goto LAB_00140420;
            local_a8.size_ = (long)local_94 + (long)local_ac;
            OPENSSL_free(*(void **)local_88);
            *(undefined8 *)local_88 = 0;
            *(undefined8 *)(local_88 + 8) = 0;
            *(uchar **)local_88 = local_a8.data_;
            *(size_t *)(local_88 + 8) = local_a8.size_;
            local_a8.data_ = (uchar *)0x0;
            local_a8.size_ = 0;
            sVar5 = ssl_ticket_aead_success;
          }
        }
      }
      OPENSSL_free(local_a8.data_);
      return sVar5;
    }
  }
LAB_00140420:
  abort();
}

Assistant:

static enum ssl_ticket_aead_result_t decrypt_ticket_with_cipher_ctx(
    Array<uint8_t> *out, EVP_CIPHER_CTX *cipher_ctx, HMAC_CTX *hmac_ctx,
    Span<const uint8_t> ticket) {
  size_t iv_len = EVP_CIPHER_CTX_iv_length(cipher_ctx);

  // Check the MAC at the end of the ticket.
  uint8_t mac[EVP_MAX_MD_SIZE];
  size_t mac_len = HMAC_size(hmac_ctx);
  if (ticket.size() < SSL_TICKET_KEY_NAME_LEN + iv_len + 1 + mac_len) {
    // The ticket must be large enough for key name, IV, data, and MAC.
    return ssl_ticket_aead_ignore_ticket;
  }
  // Split the ticket into the ticket and the MAC.
  auto ticket_mac = ticket.last(mac_len);
  ticket = ticket.first(ticket.size() - mac_len);
  HMAC_Update(hmac_ctx, ticket.data(), ticket.size());
  HMAC_Final(hmac_ctx, mac, NULL);
  assert(mac_len == ticket_mac.size());
  bool mac_ok = CRYPTO_memcmp(mac, ticket_mac.data(), mac_len) == 0;
  if (CRYPTO_fuzzer_mode_enabled()) {
    mac_ok = true;
  }
  if (!mac_ok) {
    return ssl_ticket_aead_ignore_ticket;
  }

  // Decrypt the session data.
  auto ciphertext = ticket.subspan(SSL_TICKET_KEY_NAME_LEN + iv_len);
  Array<uint8_t> plaintext;
  if (CRYPTO_fuzzer_mode_enabled()) {
    if (!plaintext.CopyFrom(ciphertext)) {
      return ssl_ticket_aead_error;
    }
  } else {
    if (ciphertext.size() >= INT_MAX) {
      return ssl_ticket_aead_ignore_ticket;
    }
    if (!plaintext.InitForOverwrite(ciphertext.size())) {
      return ssl_ticket_aead_error;
    }
    int len1, len2;
    if (!EVP_DecryptUpdate(cipher_ctx, plaintext.data(), &len1,
                           ciphertext.data(), (int)ciphertext.size()) ||
        !EVP_DecryptFinal_ex(cipher_ctx, plaintext.data() + len1, &len2)) {
      ERR_clear_error();
      return ssl_ticket_aead_ignore_ticket;
    }
    plaintext.Shrink(static_cast<size_t>(len1) + len2);
  }

  *out = std::move(plaintext);
  return ssl_ticket_aead_success;
}